

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_button_text_styled(nk_context *ctx,nk_style_button *style,char *title,int len)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_widget_layout_states nVar3;
  nk_context *in;
  nk_rect bounds;
  
  nVar3 = NK_WIDGET_INVALID;
  if ((((ctx != (nk_context *)0x0 && style != (nk_style_button *)0x0) &&
       (pnVar1 = ctx->current, nVar3 = NK_WIDGET_INVALID, pnVar1 != (nk_window *)0x0)) &&
      (pnVar2 = pnVar1->layout, pnVar2 != (nk_panel *)0x0)) &&
     (nVar3 = nk_widget(&bounds,ctx), nVar3 != NK_WIDGET_INVALID)) {
    if (nVar3 == NK_WIDGET_ROM) {
      in = (nk_context *)0x0;
    }
    else {
      in = (nk_context *)0x0;
      if ((pnVar2->flags & 0x1000) == 0) {
        in = ctx;
      }
    }
    nVar3 = nk_do_button_text(&ctx->last_widget_state,&pnVar1->buffer,bounds,title,len,
                              style->text_alignment,ctx->button_behavior,style,&in->input,
                              (ctx->style).font);
  }
  return nVar3;
}

Assistant:

NK_API nk_bool
nk_button_text_styled(struct nk_context *ctx,
const struct nk_style_button *style, const char *title, int len)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;

struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(style);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!style || !ctx || !ctx->current || !ctx->current->layout) return 0;

win = ctx->current;
layout = win->layout;
state = nk_widget(&bounds, ctx);

if (!state) return 0;
in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
return nk_do_button_text(&ctx->last_widget_state, &win->buffer, bounds,
title, len, style->text_alignment, ctx->button_behavior,
style, in, ctx->style.font);
}